

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void process_args(wchar_t argc,char **argv)

{
  char cVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  __gid_t _Var7;
  wchar_t wVar8;
  int iVar9;
  nh_roles_info *ri;
  char **ppcVar10;
  char *pcVar11;
  
  ri = (nh_roles_info *)nh_get_roles();
  wVar2 = initrole;
  wVar3 = initrace;
LAB_00107c56:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          wVar6 = argc;
          initrace = wVar3;
          initrole = wVar2;
          ppcVar10 = argv;
          if ((wVar6 < L'\x02') || (pcVar11 = ppcVar10[1], *pcVar11 != '-')) {
            return;
          }
          argv = ppcVar10 + 1;
          argc = wVar6 + L'\xffffffff';
          cVar1 = pcVar11[1];
          wVar2 = initrole;
          wVar3 = initrace;
          if (cVar1 != '@') break;
          random_player = '\x01';
        }
        if (cVar1 != 'D') break;
        ui_flags.playmode = 3;
      }
      if (cVar1 != 'H') break;
      _Var7 = getgid();
      iVar9 = setregid(0xffffffff,_Var7);
      if (iVar9 == -1) {
        pcVar11 = "Error processing -H";
LAB_00107ffd:
        perror(pcVar11);
        iVar9 = 0xe;
LAB_00108089:
        exit(iVar9);
      }
      if ((*argv)[2] == '\0') {
        if (wVar6 == L'\x02') {
          pcVar11 = "data directory expected after -H\n";
LAB_00108082:
          fputs(pcVar11,_stderr);
LAB_00108087:
          iVar9 = 1;
          goto LAB_00108089;
        }
        override_hackdir = ppcVar10[2];
LAB_00107f19:
        argv = ppcVar10 + 2;
        wVar2 = initrole;
        wVar3 = initrace;
        argc = wVar6 + L'\xfffffffe';
      }
      else {
        override_hackdir = *argv + 2;
        wVar2 = initrole;
        wVar3 = initrace;
      }
    }
    if (cVar1 == 'U') {
      _Var7 = getgid();
      iVar9 = setregid(0xffffffff,_Var7);
      if (iVar9 == -1) {
        pcVar11 = "Error processing -U";
        goto LAB_00107ffd;
      }
      if ((*argv)[2] == '\0') {
        if (wVar6 == L'\x02') {
          pcVar11 = "user directory expected after -U\n";
          goto LAB_00108082;
        }
        override_userdir = ppcVar10[2];
        goto LAB_00107f19;
      }
      override_userdir = *argv + 2;
      wVar2 = initrole;
      wVar3 = initrace;
      goto LAB_00107c56;
    }
    if (cVar1 != 'V') {
      if (cVar1 == 'X') {
        ui_flags.playmode = 2;
        goto LAB_00107c56;
      }
      if (cVar1 == 'p') {
        if (pcVar11[2] == '\0') {
          argc = L'\x01';
          if (wVar6 != L'\x02') {
            wVar8 = str2role(ri,ppcVar10[2]);
            wVar4 = wVar8;
            wVar2 = initrole;
            wVar5 = initrace;
            wVar3 = initrace;
            goto joined_r0x00107e75;
          }
          goto LAB_00107c56;
        }
        pcVar11 = pcVar11 + 2;
      }
      else {
        if (cVar1 == 'r') {
          if (pcVar11[2] == '\0') {
            argc = L'\x01';
            if (wVar6 != L'\x02') {
              wVar8 = str2race(ri,ppcVar10[2]);
              wVar4 = initrole;
              wVar2 = initrole;
              wVar5 = wVar8;
              wVar3 = initrace;
joined_r0x00107e75:
              initrace = wVar5;
              initrole = wVar4;
              argv = ppcVar10 + 2;
              argc = wVar6 + L'\xfffffffe';
              if (L'\xffffffff' < wVar8) goto LAB_00107f19;
            }
          }
          else {
            wVar6 = str2race(ri,pcVar11 + 2);
            wVar2 = initrole;
            wVar3 = initrace;
            if (L'\xffffffff' < wVar6) {
              wVar3 = wVar6;
            }
          }
          goto LAB_00107c56;
        }
        if (cVar1 == 'u') {
          if (pcVar11[2] == '\0') {
            if (wVar6 == L'\x02') {
              pcVar11 = "Player name expected after -u\n";
              goto LAB_00108082;
            }
            strncpy(settings.plname,ppcVar10[2],0xff);
            goto LAB_00107f19;
          }
          strncpy(settings.plname,pcVar11 + 2,0xff);
          wVar2 = initrole;
          wVar3 = initrace;
          goto LAB_00107c56;
        }
        if (cVar1 == '-') {
          iVar9 = strcmp(pcVar11,"--help");
          if (iVar9 == 0) {
            puts("Usage: dynamohack [OPTIONS]");
            putchar(10);
            puts("--help      show this help and exit");
            puts("--version   show version number and exit");
            puts("-D          start games in wizard mode");
            puts("-X          start games in explore mode");
            puts("-u name     specify player name");
            puts("-p role     specify role");
            puts("-r race     specify race");
            puts("-@          specify a random character");
            puts("-H dir      override the data directory");
            puts("-V dir      override the variable data \"playground\" directory");
            puts("-U dir      override the user directory");
LAB_00108031:
            exit(0);
          }
          iVar9 = strcmp(pcVar11,"--version");
          if (iVar9 == 0) {
            printf("DynaMoHack version %d.%d.%d\n",0,0,1);
            goto LAB_00108031;
          }
          fprintf(_stderr,"Unrecognized option \'%s\'\n",pcVar11);
          goto LAB_00108087;
        }
      }
      wVar6 = str2role(ri,pcVar11);
      wVar2 = initrole;
      wVar3 = initrace;
      if (L'\xffffffff' < wVar6) {
        wVar2 = wVar6;
      }
      goto LAB_00107c56;
    }
    _Var7 = getgid();
    iVar9 = setregid(0xffffffff,_Var7);
    if (iVar9 == -1) {
      pcVar11 = "Error processing -V";
      goto LAB_00107ffd;
    }
    if ((*argv)[2] == '\0') {
      if (wVar6 == L'\x02') {
        pcVar11 = "variable data directory expected after -V\n";
        goto LAB_00108082;
      }
      override_vardir = ppcVar10[2];
      goto LAB_00107f19;
    }
    override_vardir = *argv + 2;
    wVar2 = initrole;
    wVar3 = initrace;
  } while( true );
}

Assistant:

static void process_args(int argc, char *argv[])
{
    int i;
    const struct nh_roles_info *ri = nh_get_roles();

    /*
     * Process options.
     */
    while (argc > 1 && argv[1][0] == '-') {
	argv++;
	argc--;
	switch (argv[0][1]) {
	case '-':
	    if (!strcmp(argv[0], "--help")) {
		puts("Usage: dynamohack [OPTIONS]");
		puts("");
		puts("--help      show this help and exit");
		puts("--version   show version number and exit");
		puts("-D          start games in wizard mode");
		puts("-X          start games in explore mode");
		puts("-u name     specify player name");
		puts("-p role     specify role");
		puts("-r race     specify race");
		puts("-@          specify a random character");
		puts("-H dir      override the data directory");
		puts("-V dir      override the variable data \"playground\" directory");
		puts("-U dir      override the user directory");
		exit(0);
	    } else if (!strcmp(argv[0], "--version")) {
		printf("DynaMoHack version %d.%d.%d\n",
		       VERSION_MAJOR, VERSION_MINOR, PATCHLEVEL);
		exit(0);
	    } else {
		fprintf(stderr, "Unrecognized option '%s'\n", argv[0]);
		exit(1);
	    }
	    break;

	case 'D':
	    ui_flags.playmode = MODE_WIZARD;
	    break;

	case 'X':
	    ui_flags.playmode = MODE_EXPLORE;
	    break;

	case 'u':
	    if (argv[0][2]) {
		/* -uname */
		strncpy(settings.plname, argv[0]+2, sizeof(settings.plname)-1);
	    } else if (argc > 1) {
		/* -u name */
		argc--;
		argv++;
		strncpy(settings.plname, argv[0], sizeof(settings.plname)-1);
	    } else {
		fputs("Player name expected after -u\n", stderr);
		exit(1);
	    }
	    break;

	case 'p': /* profession (role) */
	    if (argv[0][2]) {
		i = str2role(ri, &argv[0][2]);
		if (i >= 0)
		    initrole = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2role(ri, argv[0]);
		if (i >= 0)
		    initrole = i;
	    }
	    break;

	case 'r': /* race */
	    if (argv[0][2]) {
		i = str2race(ri, &argv[0][2]);
		if (i >= 0)
		    initrace = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2race(ri, argv[0]);
		if (i >= 0)
		    initrace = i;
	    }
	    break;

	case '@':
	    random_player = TRUE;
	    break;

	case 'H':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -H");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Hdir */
		override_hackdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -H dir */
		argv++;
		argc--;
		override_hackdir = argv[0];
	    } else {
		fputs("data directory expected after -H\n", stderr);
		exit(1);
	    }
	    break;

	case 'V':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -V");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Vdir */
		override_vardir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -V dir */
		argv++;
		argc--;
		override_vardir = argv[0];
	    } else {
		fputs("variable data directory expected after -V\n", stderr);
		exit(1);
	    }
	    break;

	case 'U':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -U");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Udir */
		override_userdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -U dir */
		argv++;
		argc--;
		override_userdir = argv[0];
	    } else {
		fputs("user directory expected after -U\n", stderr);
		exit(1);
	    }
	    break;

	default:
	    i = str2role(ri, argv[0]);
	    if (i >= 0)
		initrole = i;
	}
    }
}